

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O2

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeMwithJacobians
          (Matrix3d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,cayley_t *cayley,Matrix3d *M_jac1,Matrix3d *M_jac2,
          Matrix3d *M_jac3)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Scalar SVar6;
  Scalar SVar7;
  Scalar SVar8;
  Scalar SVar9;
  Scalar SVar10;
  rotation_t R;
  double *local_198 [2];
  rotation_t *local_188;
  double *local_180;
  undefined8 uStack_178;
  rotation_t *local_170;
  Matrix3d *local_168;
  double *pdStack_160;
  double *local_158;
  rotation_t *local_150;
  Matrix3d *local_148;
  double *pdStack_140;
  undefined8 local_138;
  rotation_t *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  rotation_t R_jac3;
  rotation_t R_jac1;
  rotation_t R_jac2;
  
  math::cayley2rot_reduced(cayley);
  dVar4 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  dVar5 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  dVar3 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       dVar4 + dVar4;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       dVar5 + dVar5;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       dVar4 * -2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       dVar3 * 2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       dVar5 * -2.0;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       dVar3 * -2.0;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       2.0;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       2.0;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -2.0;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -2.0;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       2.0;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovlpd_avx((undefined1  [16])
                           R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array._0_16_);
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_16_
       = vshufpd_avx((undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._56_16_,
                     (undefined1  [16])
                     R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._0_16_,1);
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._56_16_
       = vshufpd_avx((undefined1  [16])
                     R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._0_16_,
                     (undefined1  [16])
                     R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._56_16_,1);
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._40_16_
       = vshufpd_avx((undefined1  [16])
                     R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._0_16_,
                     (undefined1  [16])
                     R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                     m_data.array._0_16_,1);
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)vmovlpd_avx((undefined1  [16])
                           R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array._56_16_);
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx((undefined1  [16])
                           R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array._56_16_);
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = yyF;
  pdStack_160 = pdVar1;
  local_150 = &R;
  R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
  ;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
  ;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
  ;
  R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
  ;
  R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._24_16_
       = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
         _0_16_;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R;
  local_148 = yzF;
  pdStack_140 = pdVar2;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar2;
  local_188 = &R;
  local_168 = zzF;
  pdStack_160 = pdVar2;
  local_150 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_188 = (rotation_t *)0x4000000000000000;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = SVar8 + SVar7 + SVar6;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R_jac1;
  local_148 = yyF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R_jac1;
  local_148 = yzF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R;
  local_148 = yzF;
  pdStack_140 = pdVar1;
  local_130 = &R_jac1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0x4000000000000000;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R_jac1;
  local_148 = zzF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_170 = &R_jac2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0x4000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_148 = yyF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  local_170 = &R_jac2;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_148 = yzF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 2;
  local_130 = &R_jac2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R;
  local_148 = yzF;
  pdStack_140 = pdVar1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_170 = &R_jac2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0x4000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_148 = zzF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_170 = &R_jac3;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0x4000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_148 = yyF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_170 = &R_jac3;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x2;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_148 = yzF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_130 = &R_jac3;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R;
  local_148 = yzF;
  pdStack_140 = pdVar1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_188 = (rotation_t *)0x4000000000000000;
  local_170 = &R_jac3;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_148 = zzF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[0];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = yzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_188 = (rotation_t *)0xbff0000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R;
  local_148 = xyF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_188 = (rotation_t *)0xbff0000000000000;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar2;
  local_170 = &R;
  local_148 = zzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar2;
  local_188 = &R;
  pdStack_160 = pdVar1;
  local_150 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  local_188 = &R_jac1;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = SVar8 + SVar9 + SVar7 + SVar6;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_168 = yzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = yzF;
  pdStack_160 = (double *)&R_jac1;
  local_150 = &R_jac1;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_188 = (rotation_t *)0xc000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R_jac1;
  local_148 = xyF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_198[0] = pdVar1;
  local_188 = &R_jac1;
  pdStack_160 = (double *)zzF;
  local_158 = (double *)&R;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar10 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)zzF;
  local_158 = (double *)&R_jac1;
  local_148 = &R_jac1;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar10 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R_jac1;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 1;
  local_188 = &R;
  pdStack_160 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_150 = &R_jac1;
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  local_188 = &R_jac2;
  pdStack_160 = (double *)&R;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_168 = yzF;
  local_150 = (rotation_t *)pdStack_160;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_188 = &R;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_168 = yzF;
  pdStack_160 = (double *)&R_jac2;
  local_150 = &R_jac2;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_188 = (rotation_t *)0xc000000000000000;
  local_180 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R_jac2;
  local_148 = xyF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_198[0] = pdVar1;
  local_188 = &R_jac2;
  pdStack_160 = (double *)zzF;
  local_158 = (double *)&R;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 1;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar10 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)zzF;
  local_158 = (double *)&R_jac2;
  local_148 = &R_jac2;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar10 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R_jac2;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 1;
  pdStack_160 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2;
  local_150 = &R_jac2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  local_188 = &R_jac3;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_168 = yzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = yzF;
  pdStack_160 = (double *)&R_jac3;
  local_150 = &R_jac3;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_188 = (rotation_t *)0xc000000000000000;
  local_180 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R_jac3;
  local_148 = xyF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_198[0] = pdVar1;
  local_188 = &R_jac3;
  pdStack_160 = (double *)zzF;
  local_158 = (double *)&R;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 1;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar10 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)zzF;
  local_158 = (double *)&R_jac3;
  local_148 = &R_jac3;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar10 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R_jac3;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 1;
  pdStack_160 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 2;
  local_150 = &R_jac3;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = xyF;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_188 = (rotation_t *)0xbff0000000000000;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R;
  local_148 = yyF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_188 = (rotation_t *)0xbff0000000000000;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = yzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  local_188 = &R_jac1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = SVar8 + SVar9 + SVar7 + SVar6;
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_168 = xyF;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_160 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = xyF;
  local_150 = &R_jac1;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R_jac1;
  pdStack_160 = (double *)yyF;
  local_158 = (double *)&R;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar10 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[6];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)yyF;
  local_158 = (double *)&R_jac1;
  local_148 = &R_jac1;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar10 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[6];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R_jac1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R_jac1;
  local_168 = yzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_160 = (double *)&R_jac1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = yzF;
  local_150 = (rotation_t *)pdStack_160;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_188 = &R_jac2;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_168 = xyF;
  pdStack_160 = pdVar1;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_160 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = xyF;
  local_150 = &R_jac2;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R_jac2;
  pdStack_160 = (double *)yyF;
  local_158 = (double *)&R;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar10 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[6];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)yyF;
  local_158 = (double *)&R_jac2;
  local_148 = &R_jac2;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  pdVar2 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar10 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[6];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar2;
  local_170 = &R_jac2;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar2;
  local_188 = &R_jac2;
  local_168 = yzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  pdStack_160 = (double *)&R_jac2;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = yzF;
  local_150 = (rotation_t *)pdStack_160;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_188 = &R_jac3;
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_168 = xyF;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_160 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = xyF;
  local_150 = &R_jac3;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R_jac3;
  pdStack_160 = (double *)yyF;
  local_158 = (double *)&R;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar10 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[6];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)yyF;
  local_158 = (double *)&R_jac3;
  local_148 = &R_jac3;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  pdVar2 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 1;
  local_130 = &R;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar10 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[6];
  local_188 = (rotation_t *)0xc000000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar2;
  local_170 = &R_jac3;
  pdStack_140 = pdVar1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar2;
  local_188 = &R_jac3;
  local_168 = yzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_160 = (double *)&R_jac3;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = yzF;
  local_150 = (rotation_t *)pdStack_160;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R;
  local_188 = &R;
  local_168 = zzF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x2;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = xxF;
  pdStack_160 = pdVar1;
  local_150 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_188 = (rotation_t *)0x4000000000000000;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = SVar8 + SVar7 + SVar6;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac1;
  local_170 = &R_jac1;
  local_148 = zzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac1;
  local_170 = &R_jac1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  pdVar1 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  pdStack_140 = pdVar1;
  local_130 = &R_jac1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0x4000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R_jac1;
  local_148 = xxF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0x4000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac2;
  local_170 = &R_jac2;
  local_148 = zzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac2;
  local_170 = &R_jac2;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  pdVar1 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  pdStack_140 = pdVar1;
  local_130 = &R_jac2;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0x4000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R_jac2;
  local_148 = xxF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0x4000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac3;
  local_170 = &R_jac3;
  local_148 = zzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac3;
  local_170 = &R_jac3;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_130 = &R_jac3;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0xc000000000000000;
  pdVar1 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_148 = zxF;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  pdStack_140 = pdVar1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_170 = &R_jac3;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_188 = (rotation_t *)0x4000000000000000;
  pdStack_140 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 2;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 2;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_148 = xxF;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R;
  local_188 = &R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_188 = (rotation_t *)0xbff0000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  local_148 = yzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_188 = (rotation_t *)0xbff0000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2
  ;
  local_168 = (Matrix3d *)0x2;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  pdVar2 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = pdVar1;
  local_170 = &R;
  local_148 = xxF;
  pdStack_140 = pdVar2;
  local_130 = &R;
  SVar9 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = xyF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = SVar8 + SVar9 + SVar7 + SVar6;
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R_jac1;
  local_188 = &R_jac1;
  pdStack_160 = pdVar2;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_160 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6;
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R;
  local_188 = &R;
  local_150 = &R_jac1;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac1;
  local_170 = &R_jac1;
  local_148 = yzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_158 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x1;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R_jac1;
  pdStack_160 = (double *)xxF;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar10 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[7];
  local_180 = (double *)0x2;
  local_158 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x1;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)xxF;
  local_148 = &R_jac1;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar10 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[7];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R_jac1;
  local_168 = xyF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  pdStack_160 = (double *)&R_jac1;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = xyF;
  local_150 = (rotation_t *)pdStack_160;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R_jac2;
  local_188 = &R_jac2;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_160 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6;
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R;
  local_188 = &R;
  local_150 = &R_jac2;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac2;
  local_170 = &R_jac2;
  local_148 = yzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_158 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x1;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R_jac2;
  pdStack_160 = (double *)xxF;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar10 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[7];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_158 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  pdStack_140 = (double *)0x1;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)xxF;
  local_148 = &R_jac2;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar10 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[7];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R_jac2;
  local_168 = xyF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  pdStack_160 = (double *)&R_jac2;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = xyF;
  local_150 = (rotation_t *)pdStack_160;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_160 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 1;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R_jac3;
  local_188 = &R_jac3;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_160 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6;
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_168 = zxF;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R;
  local_188 = &R;
  local_150 = &R_jac3;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac3;
  local_170 = &R_jac3;
  local_148 = yzF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_158 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 1;
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x1;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R_jac3;
  pdStack_160 = (double *)xxF;
  local_148 = &R;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar10 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[7];
  local_180 = (double *)0x2;
  local_158 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  pdStack_140 = (double *)0x1;
  local_138 = 0;
  local_130 = (rotation_t *)0x1;
  local_188 = &R;
  pdStack_160 = (double *)xxF;
  local_148 = &R_jac3;
  SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_198);
  local_198[0] = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar10 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data.array[7];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R_jac3;
  local_168 = xyF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_198[0] = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                 array + 2;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_180 = (double *)0x2;
  uStack_178 = 0;
  pdStack_160 = (double *)&R_jac3;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_188 = &R;
  local_168 = xyF;
  local_150 = (rotation_t *)pdStack_160;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       SVar6 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
  local_180 = (double *)0x1;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x1;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = pdVar1;
  local_188 = &R;
  local_168 = xxF;
  pdStack_160 = pdVar1;
  local_150 = &R;
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  local_148 = xyF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = (double *)0x0;
  uStack_178 = 0;
  local_170 = (rotation_t *)0x1;
  local_148 = (Matrix3d *)0x0;
  pdStack_140 = (double *)0x0;
  local_138 = 1;
  local_198[0] = (double *)&R;
  local_188 = &R;
  local_168 = yyF;
  pdStack_160 = (double *)&R;
  local_150 = &R;
  SVar8 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_188 = (rotation_t *)0x4000000000000000;
  local_170 = &R_jac1;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = SVar8 + SVar7 + SVar6;
  local_148 = xxF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = (double *)&R_jac1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = (rotation_t *)local_180;
  local_148 = xyF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_140 = R_jac1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  local_148 = xyF;
  local_130 = &R_jac1;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  local_188 = (rotation_t *)0x4000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac1;
  local_170 = &R_jac1;
  local_148 = yyF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_188 = (rotation_t *)0x4000000000000000;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R_jac2;
  local_148 = xxF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac2;
  local_170 = &R_jac2;
  local_148 = xyF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_140 = R_jac2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  local_148 = xyF;
  local_130 = &R_jac2;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  local_188 = (rotation_t *)0x4000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac2;
  local_170 = &R_jac2;
  local_148 = yyF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  local_180 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 1;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  local_188 = (rotation_t *)0x4000000000000000;
  pdVar1 = R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1
  ;
  local_168 = (Matrix3d *)0x1;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_170 = &R_jac3;
  local_148 = xxF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7;
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac3;
  local_170 = &R_jac3;
  local_148 = xyF;
  pdStack_140 = pdVar1;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  pdStack_140 = R_jac3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
                .array + 1;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  local_188 = (rotation_t *)0xc000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 1;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R;
  local_170 = &R;
  local_148 = xyF;
  local_130 = &R_jac3;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  local_188 = (rotation_t *)0x4000000000000000;
  local_168 = (Matrix3d *)0x0;
  pdStack_160 = (double *)0x0;
  local_158 = (double *)0x1;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 1;
  local_180 = (double *)&R_jac3;
  local_170 = &R_jac3;
  local_148 = yyF;
  pdStack_140 = (double *)&R;
  local_130 = &R;
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)local_198);
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       SVar7 + (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[8];
  dVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[7];
  dVar3 = (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar3;
  (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac1->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar3 = (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar3;
  (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  dVar3 = (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3];
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       dVar3;
  (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       (M_jac3->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7];
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeMwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const cayley_t & cayley,
    Eigen::Matrix3d & M_jac1,
    Eigen::Matrix3d & M_jac2,
    Eigen::Matrix3d & M_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) = 2*cayley[0];
  R_jac1(0,1) = 2*cayley[1];
  R_jac1(0,2) = 2*cayley[2];
  R_jac1(1,0) = 2*cayley[1];
  R_jac1(1,1) = -2*cayley[0];
  R_jac1(1,2) = -2;
  R_jac1(2,0) = 2*cayley[2];
  R_jac1(2,1) = 2;
  R_jac1(2,2) = -2*cayley[0];
  R_jac2(0,0) = -2*cayley[1];
  R_jac2(0,1) = 2*cayley[0];
  R_jac2(0,2) = 2;
  R_jac2(1,0) = 2*cayley[0];
  R_jac2(1,1) = 2*cayley[1];
  R_jac2(1,2) = 2*cayley[2];
  R_jac2(2,0) = -2;
  R_jac2(2,1) = 2*cayley[2];
  R_jac2(2,2) = -2*cayley[1];
  R_jac3(0,0) = -2*cayley[2];
  R_jac3(0,1) = -2;
  R_jac3(0,2) = 2*cayley[0];
  R_jac3(1,0) = 2;
  R_jac3(1,1) = -2*cayley[2];
  R_jac3(1,2) = 2*cayley[1];
  R_jac3(2,0) = 2*cayley[0];
  R_jac3(2,1) = 2*cayley[1];
  R_jac3(2,2) = 2*cayley[2];

  //Fill the matrix M using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix3d M;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  M_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  M_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  M_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  M_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  M_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  M_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  M_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  M_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  M_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  M_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  M_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  M_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  M_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  M_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  M_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  M_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  M_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  M_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  M_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  M_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  M_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  M_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  M_jac3(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);
  M_jac1(1,0) = M_jac1(0,1);
  M_jac1(2,0) = M_jac1(0,2);
  M_jac1(2,1) = M_jac1(1,2);
  M_jac2(1,0) = M_jac2(0,1);
  M_jac2(2,0) = M_jac2(0,2);
  M_jac2(2,1) = M_jac2(1,2);
  M_jac3(1,0) = M_jac3(0,1);
  M_jac3(2,0) = M_jac3(0,2);
  M_jac3(2,1) = M_jac3(1,2);

  return M;
}